

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorTiledImage.cpp
# Opt level: O0

SharedPtr<Decorator> __thiscall
Rml::DecoratorTiledImageInstancer::InstanceDecorator
          (DecoratorTiledImageInstancer *this,String *param_1,PropertyDictionary *properties,
          DecoratorInstancerInterface *instancer_interface)

{
  Texture _texture;
  bool bVar1;
  element_type *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  DecoratorInstancerInterface *in_R8;
  SharedPtr<Decorator> SVar3;
  undefined1 local_a0 [8];
  SharedPtr<Rml::DecoratorTiledImage> decorator;
  Texture texture;
  Tile tile;
  DecoratorInstancerInterface *instancer_interface_local;
  PropertyDictionary *properties_local;
  String *param_1_local;
  DecoratorTiledImageInstancer *this_local;
  
  DecoratorTiled::Tile::Tile((Tile *)&texture.callback_index);
  Texture::Texture((Texture *)
                   &decorator.
                    super___shared_ptr<Rml::DecoratorTiledImage,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
  bVar1 = DecoratorTiledInstancer::GetTileProperties
                    ((DecoratorTiledInstancer *)param_1,(Tile *)&texture.callback_index,
                     (Texture *)
                     &decorator.
                      super___shared_ptr<Rml::DecoratorTiledImage,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,1,(PropertyDictionary *)instancer_interface,in_R8);
  if (bVar1) {
    MakeShared<Rml::DecoratorTiledImage>();
    this_00 = ::std::
              __shared_ptr_access<Rml::DecoratorTiledImage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<Rml::DecoratorTiledImage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_a0);
    _texture._8_8_ = texture.render_manager;
    _texture.render_manager =
         (RenderManager *)
         decorator.super___shared_ptr<Rml::DecoratorTiledImage,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    bVar1 = DecoratorTiledImage::Initialise(this_00,(Tile *)&texture.callback_index,_texture);
    if (bVar1) {
      ::std::shared_ptr<Rml::Decorator>::shared_ptr<Rml::DecoratorTiledImage,void>
                ((shared_ptr<Rml::Decorator> *)this,(shared_ptr<Rml::DecoratorTiledImage> *)local_a0
                );
    }
    else {
      ::std::shared_ptr<Rml::Decorator>::shared_ptr
                ((shared_ptr<Rml::Decorator> *)this,(nullptr_t)0x0);
    }
    ::std::shared_ptr<Rml::DecoratorTiledImage>::~shared_ptr
              ((shared_ptr<Rml::DecoratorTiledImage> *)local_a0);
    _Var2._M_pi = extraout_RDX_00;
  }
  else {
    ::std::shared_ptr<Rml::Decorator>::shared_ptr((shared_ptr<Rml::Decorator> *)this,(nullptr_t)0x0)
    ;
    _Var2._M_pi = extraout_RDX;
  }
  SVar3.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  SVar3.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (SharedPtr<Decorator>)SVar3.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SharedPtr<Decorator> DecoratorTiledImageInstancer::InstanceDecorator(const String& /*name*/, const PropertyDictionary& properties,
	const DecoratorInstancerInterface& instancer_interface)
{
	DecoratorTiled::Tile tile;
	Texture texture;

	if (!GetTileProperties(&tile, &texture, 1, properties, instancer_interface))
		return nullptr;

	auto decorator = MakeShared<DecoratorTiledImage>();

	if (!decorator->Initialise(tile, texture))
		return nullptr;

	return decorator;
}